

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_any_assign_from_any.cpp
# Opt level: O0

int main(void)

{
  bool *pbVar1;
  bool local_31;
  any local_30 [3];
  any local_18;
  any b;
  
  b._value._4_4_ = 0;
  type::any::any(&local_18);
  local_31 = true;
  type::any::any<bool>(local_30,&local_31);
  type::any::operator=(&local_18,local_30);
  type::any::~any(local_30);
  pbVar1 = type::any::as<bool>(&local_18);
  if ((*pbVar1 & 1U) == 0) {
    b._value._4_4_ = -1;
  }
  else {
    b._value._4_4_ = 0;
  }
  type::any::~any(&local_18);
  return b._value._4_4_;
}

Assistant:

int main() {
    try {
      type::any b;
      b = type::any(true);
      if (b.as<bool>()) {
        return 0;
      }
      return -1;
    }
    catch(...) {
      return -1;
    }
}